

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  NamePattern *this_00;
  Pattern *p;
  Ptr<Catch::TestSpec::Pattern> pattern;
  string token;
  string local_60;
  string local_40;
  
  std::__cxx11::string::substr((ulong)&local_40,(ulong)&this->m_arg);
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"exclude:","");
  bVar2 = startsWith(&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_40);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_40._M_string_length != 0) {
    this_00 = (NamePattern *)operator_new(0x40);
    TestSpec::NamePattern::NamePattern(this_00,&local_40);
    local_60._M_dataplus._M_p = (pointer)this_00;
    (**(code **)(*(long *)&(this_00->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared +
                0x10))(this_00);
    if (this->m_exclusion == true) {
      p = (Pattern *)operator_new(0x18);
      (p->super_SharedImpl<Catch::IShared>).m_rc = 0;
      (p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__ExcludedPattern_001d70d8;
      p[1].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)this_00;
      (**(code **)(*(long *)&(this_00->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared
                  + 0x10))(this_00);
      Ptr<Catch::TestSpec::Pattern>::operator=((Ptr<Catch::TestSpec::Pattern> *)&local_60,p);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)&local_60);
    if ((NamePattern *)local_60._M_dataplus._M_p != (NamePattern *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 0x18))();
    }
  }
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }